

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketAcceptor.cpp
# Opt level: O0

void __thiscall
FIX::SocketAcceptor::onConnect
          (SocketAcceptor *this,SocketServer *server,socket_handle a,socket_handle s)

{
  socket_handle s_00;
  bool bVar1;
  mapped_type *pmVar2;
  SocketConnection *this_00;
  SocketMonitor *pMonitor;
  mapped_type *ppSVar3;
  ostream *poVar4;
  char *pcVar5;
  Log *pLVar6;
  string local_258 [32];
  stringstream local_238 [8];
  stringstream stream;
  ostream local_228 [383];
  undefined1 local_a9;
  set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> local_a8;
  undefined1 local_68 [8];
  Sessions sessions;
  iterator iStack_30;
  int port;
  _Self local_28;
  iterator i;
  socket_handle s_local;
  socket_handle a_local;
  SocketServer *server_local;
  SocketAcceptor *this_local;
  
  i._M_node._0_4_ = s;
  i._M_node._4_4_ = a;
  bVar1 = socket_isValid(s);
  if (bVar1) {
    local_28._M_node =
         (_Base_ptr)
         std::
         map<int,_FIX::SocketConnection_*,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketConnection_*>_>_>
         ::find(&this->m_connections,(key_type *)&i);
    iStack_30 = std::
                map<int,_FIX::SocketConnection_*,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketConnection_*>_>_>
                ::end(&this->m_connections);
    bVar1 = std::operator!=(&local_28,&stack0xffffffffffffffd0);
    if (!bVar1) {
      sessions._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
           SocketServer::socketToPort(server,i._M_node._4_4_);
      pmVar2 = std::
               map<int,_std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>_>_>_>
               ::operator[](&this->m_portToSessions,
                            (key_type *)
                            ((long)&sessions._M_t._M_impl.super__Rb_tree_header._M_node_count + 4));
      std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>::set
                ((set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> *)
                 local_68,pmVar2);
      this_00 = (SocketConnection *)operator_new(0x2180);
      s_00 = (socket_handle)i._M_node;
      local_a9 = 1;
      std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>::set
                (&local_a8,
                 (set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> *)
                 local_68);
      pMonitor = SocketServer::getMonitor(server);
      SocketConnection::SocketConnection(this_00,s_00,&local_a8,pMonitor);
      local_a9 = 0;
      ppSVar3 = std::
                map<int,_FIX::SocketConnection_*,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketConnection_*>_>_>
                ::operator[](&this->m_connections,(key_type *)&i);
      *ppSVar3 = this_00;
      std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>::~set
                (&local_a8);
      std::__cxx11::stringstream::stringstream(local_238);
      poVar4 = std::operator<<(local_228,"Accepted connection from ");
      pcVar5 = socket_peername((socket_handle)i._M_node);
      poVar4 = std::operator<<(poVar4,pcVar5);
      poVar4 = std::operator<<(poVar4," on port ");
      std::ostream::operator<<
                (poVar4,sessions._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
      pLVar6 = Acceptor::getLog(&this->super_Acceptor);
      if (pLVar6 != (Log *)0x0) {
        pLVar6 = Acceptor::getLog(&this->super_Acceptor);
        std::__cxx11::stringstream::str();
        (*pLVar6->_vptr_Log[6])(pLVar6,local_258);
        std::__cxx11::string::~string(local_258);
      }
      std::__cxx11::stringstream::~stringstream(local_238);
      std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>::~set
                ((set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> *)
                 local_68);
    }
  }
  return;
}

Assistant:

void SocketAcceptor::onConnect( SocketServer& server, socket_handle a, socket_handle s )
{
  if ( !socket_isValid( s ) ) return;
  SocketConnections::iterator i = m_connections.find( s );
  if ( i != m_connections.end() ) return;
  int port = server.socketToPort( a );
  Sessions sessions = m_portToSessions[port];
  m_connections[ s ] = new SocketConnection( s, sessions, &server.getMonitor() );

  std::stringstream stream;
  stream << "Accepted connection from " << socket_peername( s ) << " on port " << port;

  if( getLog() )
    getLog()->onEvent( stream.str() );
}